

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void __thiscall embree::CommandLine::CommandLine(CommandLine *this,int argc,char **argv)

{
  char *pcVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  string *this_00;
  pointer pbVar4;
  long in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  pair<std::__detail::_Node_iterator<std::unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>,_true,_false>,_bool>
  pVar5;
  pair<std::__detail::_Node_iterator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false>,_bool>
  pVar6;
  pair<std::__detail::_Node_iterator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false>,_bool>
  pair;
  size_t i;
  pair<std::__detail::_Node_iterator<std::unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>,_true,_false>,_bool>
  cl_iter;
  pointer in_stack_ffffffffffffff08;
  unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>
  *in_stack_ffffffffffffff10;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  _Node_iterator_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
  in_stack_ffffffffffffff20;
  allocator local_71;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  _Node_iterator_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
  local_68;
  undefined1 local_60;
  ulong local_58;
  _Node_iterator_base<std::unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>,_false>
  local_50;
  undefined1 local_48;
  _Node_iterator_base<std::unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>,_false>
  local_28;
  undefined1 local_20;
  long local_18;
  int local_c;
  
  *in_RDI = 0;
  local_18 = in_RDX;
  local_c = in_ESI;
  puVar2 = (undefined8 *)::operator_new(0x18);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  std::vector<char_*,_std::allocator<char_*>_>::vector
            ((vector<char_*,_std::allocator<char_*>_> *)0x58e497);
  std::
  unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>
  ::unique_ptr<std::default_delete<std::vector<char*,std::allocator<char*>>>,void>
            (in_stack_ffffffffffffff10,(pointer)in_stack_ffffffffffffff08);
  pVar5 = std::
          unordered_set<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>,std::hash<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>>,std::equal_to<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>>,std::allocator<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>>>
          ::
          emplace<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>>
                    ((unordered_set<std::unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>,_std::hash<std::unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>_>,_std::equal_to<std::unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>_>,_std::allocator<std::unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>_>_>
                      *)in_stack_ffffffffffffff20._M_cur,
                     (unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  local_50._M_cur =
       (__node_type *)
       pVar5.first.
       super__Node_iterator_base<std::unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>,_false>
       ._M_cur;
  local_48 = pVar5.second;
  local_28._M_cur = local_50._M_cur;
  local_20 = local_48;
  std::
  unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>
                 *)in_stack_ffffffffffffff20._M_cur);
  std::__detail::
  _Node_iterator<std::unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>,_true,_false>
  ::operator->((_Node_iterator<std::unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>,_true,_false>
                *)0x58e51a);
  pvVar3 = std::
           unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>
           ::get(in_stack_ffffffffffffff10);
  *in_RDI = pvVar3;
  for (local_58 = 0; local_58 < (ulong)(long)local_c; local_58 = local_58 + 1) {
    this_00 = (string *)::operator_new(0x20);
    pcVar1 = *(char **)(local_18 + local_58 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,pcVar1,&local_71);
    this_01 = &local_70;
    std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>::
    unique_ptr<std::default_delete<std::__cxx11::string>,void>(this_01,in_stack_ffffffffffffff08);
    pVar6 = std::
            unordered_set<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::hash<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,std::equal_to<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>
            ::
            emplace<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>
                      ((unordered_set<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::hash<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::equal_to<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_ffffffffffffff20._M_cur,
                       (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    in_stack_ffffffffffffff20._M_cur =
         (__node_type *)
         pVar6.first.
         super__Node_iterator_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
         ._M_cur;
    in_stack_ffffffffffffff1f = pVar6.second;
    local_68._M_cur = in_stack_ffffffffffffff20._M_cur;
    local_60 = in_stack_ffffffffffffff1f;
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff20._M_cur);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    in_stack_ffffffffffffff08 = (pointer)*in_RDI;
    std::__detail::
    _Node_iterator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false>
    ::operator->((_Node_iterator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false>
                  *)0x58e647);
    pbVar4 = std::
             unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::get(this_01);
    std::__cxx11::string::operator[]((ulong)pbVar4);
    std::vector<char*,std::allocator<char*>>::emplace_back<char*>
              ((vector<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffff20._M_cur,
               (char **)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  }
  return;
}

Assistant:

CommandLine(int argc, char** argv) : cl(nullptr)
  {
    auto cl_iter = command_line_pool.emplace(std::unique_ptr<std::vector<char*>>(new std::vector<char*>()));
    cl = cl_iter.first->get();
    for (size_t i = 0; i < argc; ++i) {
      auto pair = string_pool.emplace(std::unique_ptr<std::string>{new std::string(argv[i])});
      cl->emplace_back(&(*pair.first->get())[0]);
    }
  }